

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,NotNode *notNode)

{
  ExpNode *pEVar1;
  
  (notNode->super_ExpNode).lValue = false;
  (notNode->super_ExpNode).pointer = false;
  (notNode->super_ExpNode).type = 8;
  (notNode->super_ExpNode).arraySize = -1;
  pEVar1 = notNode->exp;
  if (pEVar1 != (ExpNode *)0x0) {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    pEVar1 = notNode->exp;
    if (((pEVar1->arraySize < 0) && (pEVar1->type == 8)) && (pEVar1->pointer != true)) {
      return;
    }
  }
  visit();
  return;
}

Assistant:

void SemanticTypes::visit(NotNode *notNode) {

    notNode->setLValue(false);
    notNode->setArraySize(-1);
    notNode->setPointer(false);
    notNode->setType(BOOL);

    if (notNode->getExp()) {
        notNode->getExp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - signNode] INVALID EXPRESSION, line %d\n", notNode->getLine());
        return;
    }

    bool isArray = notNode->getExp()->getArraySize() > -1;
    if (notNode->getExp()->getType() != BOOL || isArray || notNode->getExp()->isPointer()) {
        fprintf(stderr, "[SEMANTIC ERROR - signNode] CANNOT NEGATIVE A NON BOOLEAN VALUE, line %d\n",
                notNode->getLine());
        return;
    }

}